

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitThrow(PrintExpressionContents *this,Throw *curr)

{
  ostream *o;
  string_view local_28;
  Throw *local_18;
  Throw *curr_local;
  PrintExpressionContents *this_local;
  
  o = this->o;
  local_18 = curr;
  curr_local = (Throw *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"throw ");
  printMedium(o,local_28);
  wasm::Name::print(&local_18->tag,this->o);
  return;
}

Assistant:

void visitThrow(Throw* curr) {
    printMedium(o, "throw ");
    curr->tag.print(o);
  }